

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O1

int duckdb::Comparators::CompareStructAndAdvance
              (data_ptr_t *left_ptr,data_ptr_t *right_ptr,child_list_t<LogicalType> *types,
              bool valid)

{
  pointer ppVar1;
  pointer ppVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  bool bVar5;
  uint uVar6;
  const_reference pvVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  ppVar1 = (types->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (types->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = ((long)ppVar1 - (long)ppVar2 >> 3) * 0x6db6db6db6db6db7;
  pdVar3 = *left_ptr;
  pdVar4 = *right_ptr;
  uVar10 = lVar11 + 7U >> 3;
  *left_ptr = pdVar3 + uVar10;
  *right_ptr = *right_ptr + uVar10;
  if (ppVar1 == ppVar2) {
    uVar8 = 0;
  }
  else {
    uVar10 = 0;
    do {
      uVar6 = 0;
      uVar12 = 0xff;
      uVar9 = 0xff;
      if (pdVar3 != (data_ptr_t)0x0) {
        uVar9 = (uint)pdVar3[uVar10 >> 3];
      }
      uVar8 = (uint)uVar10 & 7;
      uVar13 = 1 << (sbyte)uVar8;
      if (pdVar4 != (data_ptr_t)0x0) {
        uVar12 = (uint)pdVar4[uVar10 >> 3];
      }
      pvVar7 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[](types,uVar10);
      if ((((uVar9 & uVar13) != 0) == ((uVar12 & uVar13) != 0)) ||
         (bVar5 = TypeIsConstantSize((pvVar7->second).physical_type_), bVar5)) {
        pvVar7 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 ::operator[](types,uVar10);
        uVar6 = CompareValAndAdvance
                          (left_ptr,right_ptr,&pvVar7->second,(uVar9 & uVar13) != 0 && valid);
      }
      uVar8 = (uint)(((uVar12 | uVar9) >> uVar8 & 1) != 0);
      if ((uVar9 & uVar13) != 0) {
        uVar8 = -(uint)((uVar12 & uVar13) == 0) | uVar6;
      }
    } while ((uVar8 == 0) &&
            (bVar5 = lVar11 + -1 + (ulong)(lVar11 == 0) != uVar10, uVar10 = uVar10 + 1, bVar5));
  }
  return uVar8;
}

Assistant:

int Comparators::CompareStructAndAdvance(data_ptr_t &left_ptr, data_ptr_t &right_ptr,
                                         const child_list_t<LogicalType> &types, bool valid) {
	idx_t count = types.size();
	// Load validity masks
	ValidityBytes left_validity(left_ptr, types.size());
	ValidityBytes right_validity(right_ptr, types.size());
	left_ptr += (count + 7) / 8;
	right_ptr += (count + 7) / 8;
	// Initialize variables
	bool left_valid;
	bool right_valid;
	idx_t entry_idx;
	idx_t idx_in_entry;
	// Compare
	int comp_res = 0;
	for (idx_t i = 0; i < count; i++) {
		ValidityBytes::GetEntryIndex(i, entry_idx, idx_in_entry);
		left_valid = left_validity.RowIsValid(left_validity.GetValidityEntry(entry_idx), idx_in_entry);
		right_valid = right_validity.RowIsValid(right_validity.GetValidityEntry(entry_idx), idx_in_entry);
		auto &type = types[i].second;
		if ((left_valid == right_valid) || TypeIsConstantSize(type.InternalType())) {
			comp_res = CompareValAndAdvance(left_ptr, right_ptr, types[i].second, left_valid && valid);
		}
		if (!left_valid && !right_valid) {
			comp_res = 0;
		} else if (!left_valid) {
			comp_res = 1;
		} else if (!right_valid) {
			comp_res = -1;
		}
		if (comp_res != 0) {
			break;
		}
	}
	return comp_res;
}